

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

BlockGraph * __thiscall GraphBuilder::findBlock(GraphBuilder *this,BasicBlock *basicBlock)

{
  bool bVar1;
  pointer ppVar2;
  long in_RSI;
  iterator iterator;
  unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false> local_20 [3];
  BlockGraph *local_8;
  
  if (in_RSI == 0) {
    local_8 = (BlockGraph *)0x0;
  }
  else {
    local_20[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
         ::find(in_stack_ffffffffffffffc8,(key_type *)0x1933fe);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::__detail::operator==(local_20,&local_28);
    if (bVar1) {
      local_8 = (BlockGraph *)0x0;
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>,_false,_false>
                             *)0x193440);
      local_8 = ppVar2->second;
    }
  }
  return local_8;
}

Assistant:

BlockGraph *GraphBuilder::findBlock(const llvm::BasicBlock *basicBlock) {
    if (!basicBlock) {
        return nullptr;
    }
    auto iterator = this->llvmToBlockMap_.find(basicBlock);
    if (iterator == this->llvmToBlockMap_.end()) {
        return nullptr;
    }
    return iterator->second;
}